

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Array<unsigned_int>::reserve(Array<unsigned_int> *this,usize size)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  
  puVar5 = (this->_begin).item;
  if (size <= this->_capacity) {
    if (size == 0 || puVar5 != (uint *)0x0) {
      return;
    }
    puVar5 = (uint *)0x0;
    size = this->_capacity;
  }
  this->_capacity = size | 3;
  puVar2 = (uint *)operator_new__((size | 3) << 2);
  puVar4 = puVar2;
  if (puVar5 != (uint *)0x0) {
    puVar1 = (this->_end).item;
    for (puVar3 = puVar5; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar4 = *puVar3;
      puVar4 = puVar4 + 1;
    }
    operator_delete__(puVar5);
  }
  (this->_begin).item = puVar2;
  (this->_end).item = puVar4;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }